

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_interpolation_32(void)

{
  run("interpolation should not alter surrounding whitespace","| {{{string}}} |",
      "{\"string\": \"---\"}",(char *)0x0,"| --- |");
  return;
}

Assistant:

static void
test_interpolation_32(void)
{
    run(
        "interpolation should not alter surrounding whitespace",
        "| {{{string}}} |",
        "{\"string\": \"---\"}",
        NULL,
        "| --- |"
    );
}